

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_rect_height_compare(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*(ushort *)((long)a + 6) <= *(ushort *)((long)b + 6)) &&
     (uVar1 = 1, *(ushort *)((long)b + 6) <= *(ushort *)((long)a + 6))) {
    uVar1 = 0xffffffff;
    if (*(ushort *)((long)a + 4) <= *(ushort *)((long)b + 4)) {
      uVar1 = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
    }
  }
  return uVar1;
}

Assistant:

NK_INTERN int
nk_rect_height_compare(const void *a, const void *b)
{
    const struct nk_rp_rect *p = (const struct nk_rp_rect *) a;
    const struct nk_rp_rect *q = (const struct nk_rp_rect *) b;
    if (p->h > q->h)
        return -1;
    if (p->h < q->h)
        return  1;
    return (p->w > q->w) ? -1 : (p->w < q->w);
}